

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogGetPublic(xmlChar *pubID)

{
  xmlChar *pxVar1;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  if (xmlCatalogGetPublic::msg == 0) {
    xmlPrintErrorMessage("Use of deprecated xmlCatalogGetPublic() call\n");
    xmlCatalogGetPublic::msg = xmlCatalogGetPublic::msg + 1;
  }
  if ((pubID != (xmlChar *)0x0) && (xmlDefaultCatalog != (xmlCatalogPtr)0x0)) {
    pxVar1 = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml,pubID,(xmlChar *)0x0);
    if ((xmlChar *)0x1 < pxVar1 + 1) {
      snprintf((char *)xmlCatalogGetPublic::result,999,"%s",pxVar1);
      xmlCatalogGetPublic::result[999] = '\0';
      return xmlCatalogGetPublic::result;
    }
    if (xmlDefaultCatalog != (xmlCatalogPtr)0x0) {
      pxVar1 = xmlCatalogGetSGMLPublic(xmlDefaultCatalog->sgml,pubID);
      return pxVar1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlCatalogGetPublic(const xmlChar *pubID) {
    xmlChar *ret;
    static xmlChar result[1000];
    static int msg = 0;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if (msg == 0) {
	xmlPrintErrorMessage(
		"Use of deprecated xmlCatalogGetPublic() call\n");
	msg++;
    }

    if (pubID == NULL)
	return(NULL);

    /*
     * Check first the XML catalogs
     */
    if (xmlDefaultCatalog != NULL) {
	ret = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml, pubID, NULL);
	if ((ret != NULL) && (ret != XML_CATAL_BREAK)) {
	    snprintf((char *) result, sizeof(result) - 1, "%s", (char *) ret);
	    result[sizeof(result) - 1] = 0;
	    return(result);
	}
    }

    if (xmlDefaultCatalog != NULL)
	return(xmlCatalogGetSGMLPublic(xmlDefaultCatalog->sgml, pubID));
    return(NULL);
}